

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# policy.cpp
# Opt level: O2

bool IsStandard(CScript *scriptPubKey,optional<unsigned_int> *max_datacarrier_bytes,
               TxoutType *whichType)

{
  byte bVar1;
  uint uVar2;
  TxoutType TVar3;
  uint uVar4;
  bool bVar5;
  long in_FS_OFFSET;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  vSolutions;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_38.
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_38.
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38.
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  TVar3 = Solver(scriptPubKey,&local_38);
  *whichType = TVar3;
  if (TVar3 != NONSTANDARD) {
    if (TVar3 == MULTISIG) {
      bVar1 = *local_38.
               super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish[-1].
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((0xfc < (byte)(bVar1 - 4)) &&
         ((byte)(*((local_38.
                    super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start)->
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                  super__Vector_impl_data._M_start - 1) < bVar1)) goto LAB_00a9f3e0;
    }
    else {
      if (TVar3 != NULL_DATA) {
LAB_00a9f3e0:
        bVar5 = true;
        goto LAB_00a9f3e6;
      }
      if ((max_datacarrier_bytes->super__Optional_base<unsigned_int,_true,_true>)._M_payload.
          super__Optional_payload_base<unsigned_int>._M_engaged == true) {
        uVar2 = (scriptPubKey->super_CScriptBase)._size;
        uVar4 = uVar2 - 0x1d;
        if (uVar2 < 0x1d) {
          uVar4 = uVar2;
        }
        if (uVar4 <= (max_datacarrier_bytes->super__Optional_base<unsigned_int,_true,_true>).
                     _M_payload.super__Optional_payload_base<unsigned_int>._M_payload._M_value)
        goto LAB_00a9f3e0;
      }
    }
  }
  bVar5 = false;
LAB_00a9f3e6:
  std::
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::~vector(&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
    __stack_chk_fail();
  }
  return bVar5;
}

Assistant:

bool IsStandard(const CScript& scriptPubKey, const std::optional<unsigned>& max_datacarrier_bytes, TxoutType& whichType)
{
    std::vector<std::vector<unsigned char> > vSolutions;
    whichType = Solver(scriptPubKey, vSolutions);

    if (whichType == TxoutType::NONSTANDARD) {
        return false;
    } else if (whichType == TxoutType::MULTISIG) {
        unsigned char m = vSolutions.front()[0];
        unsigned char n = vSolutions.back()[0];
        // Support up to x-of-3 multisig txns as standard
        if (n < 1 || n > 3)
            return false;
        if (m < 1 || m > n)
            return false;
    } else if (whichType == TxoutType::NULL_DATA) {
        if (!max_datacarrier_bytes || scriptPubKey.size() > *max_datacarrier_bytes) {
            return false;
        }
    }

    return true;
}